

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O0

vector<OpTpl_*,_std::allocator<OpTpl_*>_> * __thiscall
PcodeCompile::createStore(PcodeCompile *this,StarQuality *qual,ExprTree *ptr,ExprTree *val)

{
  vector<OpTpl*,std::allocator<OpTpl*>> *this_00;
  vector<OpTpl_*,_std::allocator<OpTpl_*>_> *pvVar1;
  ExprTree *pEVar2;
  OpTpl *this_01;
  VarnodeTpl *pVVar3;
  ConstTpl local_d8;
  ConstTpl local_b8;
  ConstTpl local_98;
  VarnodeTpl *local_78;
  VarnodeTpl *spcvn;
  OpTpl *local_60;
  OpTpl *op;
  OpTpl **local_50;
  __normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_> local_48;
  __normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_> local_40;
  const_iterator local_38;
  vector<OpTpl*,std::allocator<OpTpl*>> *local_30;
  vector<OpTpl_*,_std::allocator<OpTpl_*>_> *res;
  ExprTree *val_local;
  ExprTree *ptr_local;
  StarQuality *qual_local;
  PcodeCompile *this_local;
  
  this_00 = (vector<OpTpl*,std::allocator<OpTpl*>> *)ptr->ops;
  ptr->ops = (vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)0x0;
  local_30 = this_00;
  res = (vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)val;
  val_local = ptr;
  ptr_local = (ExprTree *)qual;
  qual_local = (StarQuality *)this;
  local_40._M_current =
       (OpTpl **)
       std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::end
                 ((vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)this_00);
  __gnu_cxx::__normal_iterator<OpTpl*const*,std::vector<OpTpl*,std::allocator<OpTpl*>>>::
  __normal_iterator<OpTpl**>
            ((__normal_iterator<OpTpl*const*,std::vector<OpTpl*,std::allocator<OpTpl*>>> *)&local_38
             ,&local_40);
  local_48._M_current =
       (OpTpl **)
       std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::begin
                 ((vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)
                  (res->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.
                  super__Vector_impl_data._M_start);
  local_50 = (OpTpl **)
             std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::end
                       ((vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)
                        (res->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.
                        super__Vector_impl_data._M_start);
  op = (OpTpl *)std::vector<OpTpl*,std::allocator<OpTpl*>>::
                insert<__gnu_cxx::__normal_iterator<OpTpl**,std::vector<OpTpl*,std::allocator<OpTpl*>>>,void>
                          (this_00,local_38,local_48,
                           (__normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>
                            )local_50);
  std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::clear
            ((vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)
             (res->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.
             super__Vector_impl_data._M_start);
  this_01 = (OpTpl *)operator_new(0x28);
  OpTpl::OpTpl(this_01,CPUI_STORE);
  local_60 = this_01;
  pVVar3 = (VarnodeTpl *)operator_new(0x68);
  ConstTpl::ConstTpl(&local_98,this->constantspace);
  pEVar2 = ptr_local;
  ConstTpl::ConstTpl(&local_b8,real,8);
  VarnodeTpl::VarnodeTpl(pVVar3,&local_98,(ConstTpl *)pEVar2,&local_b8);
  local_78 = pVVar3;
  OpTpl::addInput(local_60,pVVar3);
  OpTpl::addInput(local_60,val_local->outvn);
  OpTpl::addInput(local_60,(VarnodeTpl *)
                           (res->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.
                           super__Vector_impl_data._M_finish);
  std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::push_back
            ((vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)local_30,&local_60);
  pVVar3 = (VarnodeTpl *)
           (res->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  ConstTpl::ConstTpl(&local_d8,real,(ulong)*(uint *)&ptr_local[2].ops);
  force_size(pVVar3,&local_d8,(vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)local_30);
  pEVar2 = val_local;
  val_local->outvn = (VarnodeTpl *)0x0;
  (res->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (val_local != (ExprTree *)0x0) {
    ExprTree::~ExprTree(val_local);
    operator_delete(pEVar2);
  }
  pvVar1 = res;
  if (res != (vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)0x0) {
    ExprTree::~ExprTree((ExprTree *)res);
    operator_delete(pvVar1);
  }
  if (ptr_local != (ExprTree *)0x0) {
    operator_delete(ptr_local);
  }
  return (vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)local_30;
}

Assistant:

vector<OpTpl *> *PcodeCompile::createStore(StarQuality *qual,
					      ExprTree *ptr,ExprTree *val)
{
  vector<OpTpl *> *res = ptr->ops;
  ptr->ops = (vector<OpTpl *> *)0;
  res->insert(res->end(),val->ops->begin(),val->ops->end());
  val->ops->clear();
  OpTpl *op = new OpTpl(CPUI_STORE);
  // The first varnode input to the store is a constant reference to the AddrSpace being loaded
  // from.  Internally, we really store the pointer to the AddrSpace as the reference, but this
  // isn't platform independent. So officially, we assume that the constant reference will be the
  // AddrSpace index.  We can safely assume this always has size 4.
  VarnodeTpl *spcvn = new VarnodeTpl(ConstTpl(constantspace),
				     qual->id,
				     ConstTpl(ConstTpl::real,8));
  op->addInput(spcvn);
  op->addInput(ptr->outvn);
  op->addInput(val->outvn);
  res->push_back(op);
  force_size(val->outvn,ConstTpl(ConstTpl::real,qual->size),*res);
  ptr->outvn = (VarnodeTpl *)0;
  val->outvn = (VarnodeTpl *)0;
  delete ptr;
  delete val;
  delete qual;
  return res;
}